

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_io.cc
# Opt level: O0

ImageHeaders core::image::load_png_file_headers(string *filename)

{
  FILE *filename_00;
  char *pcVar1;
  FileException *this;
  int *piVar2;
  png_infop local_38;
  png_infop png_info;
  png_structp png;
  FILE *fp;
  string *filename_local;
  ImageHeaders headers;
  
  fp = (FILE *)filename;
  pcVar1 = (char *)std::__cxx11::string::c_str();
  png = (png_structp)fopen(pcVar1,"rb");
  if ((FILE *)png == (FILE *)0x0) {
    this = (FileException *)__cxa_allocate_exception(0x48);
    filename_00 = fp;
    piVar2 = __errno_location();
    pcVar1 = strerror(*piVar2);
    util::FileException::FileException(this,(string *)filename_00,pcVar1);
    __cxa_throw(this,&util::FileException::typeinfo,util::FileException::~FileException);
  }
  png_info = (png_infop)0x0;
  local_38 = (png_infop)0x0;
  anon_unknown_19::load_png_headers_intern
            ((FILE *)png,(ImageHeaders *)&filename_local,(png_structp *)&png_info,&local_38);
  png_destroy_read_struct(&png_info,&local_38,0);
  fclose((FILE *)png);
  return _filename_local;
}

Assistant:

ImageHeaders
load_png_file_headers (std::string const& filename)
{
    FILE* fp = std::fopen(filename.c_str(), "rb");
    if (fp == nullptr)
        throw util::FileException(filename, std::strerror(errno));

    /* Read PNG header info. */
    ImageHeaders headers;
    png_structp png = nullptr;
    png_infop png_info = nullptr;
    load_png_headers_intern(fp, &headers, &png, &png_info);

    /* Clean up. */
    png_destroy_read_struct(&png, &png_info, nullptr);
    std::fclose(fp);

    return headers;
}